

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
          (SmallVectorBase<slang::ast::DistExpression::DistItem> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  Expression *pEVar2;
  undefined8 uVar3;
  optional<slang::ast::DistExpression::DistWeight> *poVar4;
  bool bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  byte *pbVar13;
  byte *pbVar14;
  pointer pDVar15;
  byte *pbVar16;
  pointer pDVar17;
  byte *pbVar18;
  
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar13 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar16 = pbVar13 + sVar1 * 0x20;
  if (*(byte **)(dst + 8) < pbVar16) {
    pbVar14 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x20,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_004a67d8;
    pDVar15 = this->data_;
    pDVar17 = pDVar15 + sVar1;
    pbVar16 = pbVar14 + sVar1 * 0x20;
    pbVar13 = pbVar14;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar16;
    pDVar15 = this->data_;
    pDVar17 = pDVar15 + sVar1;
    pbVar14 = pbVar13;
  }
  do {
    pbVar18 = pbVar13 + 0x20;
    pEVar2 = pDVar15->value;
    uVar3 = *(undefined8 *)
             &(pDVar15->weight).
              super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload;
    poVar4 = &pDVar15->weight;
    bVar5 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            _M_engaged;
    uVar6 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            field_0x11;
    uVar7 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            field_0x12;
    uVar8 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            field_0x13;
    uVar9 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
            _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
            field_0x14;
    uVar10 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
             _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
             field_0x15;
    uVar11 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
             _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
             field_0x16;
    uVar12 = (poVar4->super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>).
             _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>.
             field_0x17;
    *(Expression **)(pbVar13 + 0x10) =
         (pDVar15->weight).super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
         _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
         _M_value.expr;
    pbVar13[0x18] = bVar5;
    pbVar13[0x19] = uVar6;
    pbVar13[0x1a] = uVar7;
    pbVar13[0x1b] = uVar8;
    pbVar13[0x1c] = uVar9;
    pbVar13[0x1d] = uVar10;
    pbVar13[0x1e] = uVar11;
    pbVar13[0x1f] = uVar12;
    *(Expression **)pbVar13 = pEVar2;
    *(undefined8 *)(pbVar13 + 8) = uVar3;
    if (pDVar15 + 1 == pDVar17) break;
    pDVar15 = pDVar15 + 1;
    pbVar13 = pbVar18;
  } while (pbVar18 != pbVar16);
LAB_004a67d8:
  return (int)pbVar14;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }